

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::binary_reader(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                *this,iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *adapter,input_format_t format)

{
  undefined8 uVar1;
  bool bVar2;
  int_type iVar3;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char *in_stack_fffffffffffffda0;
  char (*in_stack_fffffffffffffdb0) [7];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 uVar4;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdd8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffde0;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  undefined1 local_1c9;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  undefined1 local_199;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  undefined1 local_169;
  undefined1 local_139;
  undefined1 local_109;
  undefined1 local_d9;
  undefined1 local_a9;
  undefined1 local_79;
  undefined1 local_49;
  char local_1c [7];
  detail local_15;
  undefined4 local_14;
  
  uVar1 = in_RSI[1];
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar1;
  local_14 = in_EDX;
  iVar3 = std::char_traits<char>::eof();
  *(int_type *)(in_RDI + 2) = iVar3;
  in_RDI[3] = 0;
  bVar2 = little_endianness(1);
  *(bool *)(in_RDI + 4) = bVar2;
  *(undefined4 *)((long)in_RDI + 0x24) = local_14;
  in_RDI[5] = 0;
  local_15 = (detail)0x46;
  builtin_strncpy(local_1c,"{[ZTSNH",7);
  make_array<int,char,char,char,char,char,char,char,char>
            ((array<int,_8UL> *)(in_RDI + 6),&local_15,local_1c + 6,local_1c + 5,local_1c + 4,
             local_1c + 3,local_1c + 2,local_1c + 1,local_1c,in_stack_fffffffffffffda0);
  this_00 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 10);
  local_49 = 0x43;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[5],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,(char (*) [5])in_stack_fffffffffffffdb0);
  local_79 = 0x44;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[7],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_a9 = 0x49;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[6],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,(char (*) [6])in_stack_fffffffffffffdb0);
  local_d9 = 0x4c;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[6],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,(char (*) [6])in_stack_fffffffffffffdb0);
  local_109 = 0x4d;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[7],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_139 = 0x55;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[6],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,(char (*) [6])in_stack_fffffffffffffdb0);
  local_169 = 100;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[7],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_199 = 0x69;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[5],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,(char (*) [5])in_stack_fffffffffffffdb0);
  local_1c9 = 0x6c;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[6],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,(char (*) [6])in_stack_fffffffffffffdb0);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[7],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  uVar4 = 0x75;
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<char,_const_char_(&)[7],_true>
            (this_00,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  make_array<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>
            (in_stack_fffffffffffffdb8,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xfffffffffffffdd8,&local_1f8,&local_1c8,&local_198,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(uVar4,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffdf0,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffdf8);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268a53);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268a60);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268a6d);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268a7a);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268a87);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268a94);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268aa1);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268aae);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268abb);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268ac8);
  std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x268ad5);
  return;
}

Assistant:

explicit binary_reader(InputAdapterType&& adapter, const input_format_t format = input_format_t::json) noexcept : ia(std::move(adapter)), input_format(format)
    {
        (void)detail::is_sax_static_asserts<SAX, BasicJsonType> {};
    }